

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

DVector3 * __thiscall
AActor::Vec3Offset(DVector3 *__return_storage_ptr__,AActor *this,double dx,double dy,double dz,
                  bool absolute)

{
  double dVar1;
  double dVar2;
  undefined3 in_register_00000011;
  DVector2 v;
  double local_28;
  double local_20;
  
  if (CONCAT31(in_register_00000011,absolute) == 0) {
    P_GetOffsetPosition((this->__Pos).X,(this->__Pos).Y,dx,dy);
    dVar1 = (this->__Pos).Z;
    __return_storage_ptr__->X = local_28;
    __return_storage_ptr__->Y = local_20;
    __return_storage_ptr__->Z = dz + dVar1;
  }
  else {
    dVar1 = (this->__Pos).Y;
    dVar2 = (this->__Pos).Z;
    __return_storage_ptr__->X = dx + (this->__Pos).X;
    __return_storage_ptr__->Y = dy + dVar1;
    __return_storage_ptr__->Z = dz + dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 Vec3Offset(double dx, double dy, double dz, bool absolute = false)
	{
		if (absolute)
		{
			return { X() + dx, Y() + dy, Z() + dz };
		}
		else
		{
			DVector2 v = P_GetOffsetPosition(X(), Y(), dx, dy);
			return DVector3(v, Z() + dz);
		}
	}